

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QDnsMailExchangeRecord>::emplace<QDnsMailExchangeRecord_const&>
          (QMovableArrayOps<QDnsMailExchangeRecord> *this,qsizetype i,QDnsMailExchangeRecord *args)

{
  QDnsMailExchangeRecord **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter IStack_58;
  QDnsMailExchangeRecord tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QDnsMailExchangeRecord>).
           super_QArrayDataPointer<QDnsMailExchangeRecord>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QDnsMailExchangeRecord>).
        super_QArrayDataPointer<QDnsMailExchangeRecord>.size == i) {
      qVar5 = QArrayDataPointer<QDnsMailExchangeRecord>::freeSpaceAtEnd
                        ((QArrayDataPointer<QDnsMailExchangeRecord> *)this);
      if (qVar5 == 0) goto LAB_002137c6;
      QDnsMailExchangeRecord::QDnsMailExchangeRecord
                ((this->super_QGenericArrayOps<QDnsMailExchangeRecord>).
                 super_QArrayDataPointer<QDnsMailExchangeRecord>.ptr +
                 (this->super_QGenericArrayOps<QDnsMailExchangeRecord>).
                 super_QArrayDataPointer<QDnsMailExchangeRecord>.size,args);
LAB_002138ab:
      pqVar2 = &(this->super_QGenericArrayOps<QDnsMailExchangeRecord>).
                super_QArrayDataPointer<QDnsMailExchangeRecord>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0021386a;
    }
LAB_002137c6:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QDnsMailExchangeRecord>::freeSpaceAtBegin
                        ((QArrayDataPointer<QDnsMailExchangeRecord> *)this);
      if (qVar5 != 0) {
        QDnsMailExchangeRecord::QDnsMailExchangeRecord
                  ((this->super_QGenericArrayOps<QDnsMailExchangeRecord>).
                   super_QArrayDataPointer<QDnsMailExchangeRecord>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QDnsMailExchangeRecord>).
                   super_QArrayDataPointer<QDnsMailExchangeRecord>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_002138ab;
      }
    }
  }
  tmp.d.d.ptr = (QSharedDataPointer<QDnsMailExchangeRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QDnsMailExchangeRecord::QDnsMailExchangeRecord(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QDnsMailExchangeRecord>).
          super_QArrayDataPointer<QDnsMailExchangeRecord>.size != 0;
  QArrayDataPointer<QDnsMailExchangeRecord>::detachAndGrow
            ((QArrayDataPointer<QDnsMailExchangeRecord> *)this,(uint)(i == 0 && bVar6),1,
             (QDnsMailExchangeRecord **)0x0,(QArrayDataPointer<QDnsMailExchangeRecord> *)0x0);
  if (i == 0 && bVar6) {
    QDnsMailExchangeRecord::QDnsMailExchangeRecord
              ((this->super_QGenericArrayOps<QDnsMailExchangeRecord>).
               super_QArrayDataPointer<QDnsMailExchangeRecord>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QDnsMailExchangeRecord>).
               super_QArrayDataPointer<QDnsMailExchangeRecord>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QDnsMailExchangeRecord>).
              super_QArrayDataPointer<QDnsMailExchangeRecord>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QDnsMailExchangeRecord> *)this,i,1);
    QDnsMailExchangeRecord::QDnsMailExchangeRecord(IStack_58.displaceFrom,&tmp);
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QDnsMailExchangeRecord::~QDnsMailExchangeRecord(&tmp);
LAB_0021386a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }